

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O2

void __thiscall S2Builder::Graph::VertexOutMap::Init(VertexOutMap *this,Graph *g)

{
  pointer ppVar1;
  uint in_EAX;
  long lVar2;
  VertexId v;
  int iVar3;
  int iVar4;
  EdgeId e;
  undefined8 uStack_28;
  
  this->edges_ = g->edges_;
  uStack_28._0_4_ = in_EAX;
  std::vector<int,_std::allocator<int>_>::reserve(&this->edge_begins_,(long)g->num_vertices_ + 1);
  uStack_28 = (ulong)(uint)uStack_28;
  for (iVar3 = 0; iVar3 <= g->num_vertices_; iVar3 = iVar3 + 1) {
    ppVar1 = (g->edges_->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    iVar4 = uStack_28._4_4_;
    for (lVar2 = (long)uStack_28._4_4_;
        (iVar4 = iVar4 + 1,
        lVar2 < (int)((ulong)((long)(g->edges_->
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) >> 3
                     ) && (ppVar1[lVar2].first < iVar3)); lVar2 = lVar2 + 1) {
      uStack_28 = CONCAT44(iVar4,(uint)uStack_28);
    }
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->edge_begins_,(value_type_conflict2 *)((long)&uStack_28 + 4));
  }
  return;
}

Assistant:

void Graph::VertexOutMap::Init(const Graph& g) {
  edges_ = &g.edges();
  edge_begins_.reserve(g.num_vertices() + 1);
  EdgeId e = 0;
  for (VertexId v = 0; v <= g.num_vertices(); ++v) {
    while (e < g.num_edges() && g.edge(e).first < v) ++e;
    edge_begins_.push_back(e);
  }
}